

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  pointer *this_00;
  pointer *this_01;
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  MatCommaInitializer_<float> *pMVar4;
  MatCommaInitializer_ *pMVar5;
  void *pvVar6;
  clock_t cVar7;
  clock_t cVar8;
  clock_t cVar9;
  Vec<float,_3> *pVVar10;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar11;
  float fVar12;
  Mat local_1a78 [96];
  Mat local_1a18 [8];
  Mat xyz;
  float fps;
  float frame_time;
  Mat rigid_body_transformation;
  Mat local_194c [8];
  Vec3f rotation_euler;
  clock_t toc_gpu;
  clock_t tic_gpu;
  MatExpr local_1918 [352];
  _InputArray local_17b8;
  _OutputArray local_17a0;
  _InputArray local_1788;
  _InputArray local_1770;
  _InputArray local_1758;
  _InputArray local_1740;
  Mat local_1728 [8];
  Mat points4D_t0;
  Mat local_16c8 [8];
  Mat points3D_t0;
  undefined1 local_1668 [8];
  vector<bool,_std::allocator<bool>_> valid;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> newPoints;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *currentPointsLeft_t1;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *currentPointsLeft_t0;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pointsRight_t1;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pointsLeft_t1;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pointsRight_t0;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pointsLeft_t0;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> oldPointsLeft_t0;
  Mat local_1580 [8];
  Mat imageRight_t1_color;
  string local_1520 [32];
  Mat local_1500 [8];
  Mat imageLeft_t1_color;
  Mat local_14a0 [8];
  Mat imageLeft_t1;
  Mat local_1440 [8];
  Mat imageRight_t1;
  int local_13dc;
  undefined1 local_13d8 [4];
  int frame_id;
  vector<FeaturePoint,_std::allocator<FeaturePoint>_> currentFeaturePointsLeft;
  vector<FeaturePoint,_std::allocator<FeaturePoint>_> oldFeaturePointsLeft;
  clock_t t_b;
  clock_t t_a;
  Mat local_1378 [8];
  Mat imageRight_t0_color;
  string local_1318 [32];
  Mat local_12f8 [8];
  Mat imageLeft_t0_color;
  int local_1294;
  Intel_V4L2 *pIStack_1290;
  int throw_frames;
  CameraBase *pCamera;
  Mat imageLeft_t0;
  Mat local_1228 [8];
  Mat imageRight_t0;
  Mat local_11c0 [4];
  int init_frame_id;
  Mat points3D;
  Mat local_1160 [8];
  Mat points4D;
  undefined1 local_1100 [8];
  FeatureSet currentVOFeatures;
  MatExpr local_f70 [8];
  Mat trajectory;
  MatExpr local_f10 [352];
  MatExpr local_db0 [8];
  Mat frame_pose32;
  MatExpr local_d50 [352];
  MatExpr local_bf0 [8];
  Mat frame_pose;
  MatExpr local_b90 [352];
  MatExpr local_a30 [8];
  Mat Rpose;
  MatExpr local_9d0 [352];
  MatExpr local_870 [8];
  Mat pose;
  MatExpr local_810 [352];
  MatExpr local_6b0 [8];
  Mat translation;
  MatExpr local_650 [352];
  MatExpr local_4f0 [8];
  Mat rotation;
  Mat_<float> local_490;
  MatCommaInitializer_<float> local_430;
  Mat_<float> local_408;
  Mat local_3a8 [8];
  Mat projMatrr;
  Mat_<float> local_348;
  MatCommaInitializer_<float> local_2e8;
  Mat_<float> local_2c0;
  Mat local_260 [8];
  Mat projMatrl;
  FileNode local_200 [28];
  float local_1e4;
  FileNode local_1e0 [4];
  float bf;
  float local_1c4;
  FileNode local_1c0 [4];
  float cy;
  float local_1a4;
  FileNode local_1a0 [4];
  float cx;
  float local_184;
  FileNode local_180 [4];
  float fy;
  float local_164;
  string local_160 [4];
  float fx;
  FileStorage local_140 [8];
  FileStorage fSettings;
  allocator local_f9;
  string local_f8 [8];
  string strSettingPath;
  allocator local_d1;
  string local_d0 [8];
  string filepath;
  string local_a8 [32];
  vector<Matrix,_std::allocator<Matrix>_> local_88;
  allocator local_69;
  string local_68 [8];
  string filename_pose;
  undefined1 local_38 [8];
  vector<Matrix,_std::allocator<Matrix>_> pose_matrix_gt;
  bool use_intel_rgbd;
  bool display_ground_truth;
  char **argv_local;
  int argc_local;
  
  pose_matrix_gt.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._7_1_ = 0;
  pose_matrix_gt.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._6_1_ = 0;
  std::vector<Matrix,_std::allocator<Matrix>_>::vector
            ((vector<Matrix,_std::allocator<Matrix>_> *)local_38);
  if (argc == 4) {
    pose_matrix_gt.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    poVar3 = std::operator<<((ostream *)&std::cerr,"Display ground truth trajectory");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = argv[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar1,&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::string(local_a8,local_68);
    loadPoses(&local_88,local_a8);
    std::vector<Matrix,_std::allocator<Matrix>_>::operator=
              ((vector<Matrix,_std::allocator<Matrix>_> *)local_38,&local_88);
    std::vector<Matrix,_std::allocator<Matrix>_>::~vector(&local_88);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_68);
  }
  if (argc < 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Usage: ./run path_to_sequence(rgbd for using intel rgbd) path_to_calibration [optional]path_to_ground_truth_pose"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,pcVar1,&local_d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    poVar3 = std::operator<<((ostream *)&std::cout,"Filepath: ");
    poVar3 = std::operator<<(poVar3,local_d0);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d0,"rgbd");
    if (bVar2) {
      pose_matrix_gt.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    }
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,pcVar1,&local_f9);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    poVar3 = std::operator<<((ostream *)&std::cout,"Calibration Filepath: ");
    poVar3 = std::operator<<(poVar3,local_f8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_160);
    cv::FileStorage::FileStorage(local_140,local_f8,0,local_160);
    std::__cxx11::string::~string(local_160);
    cv::FileStorage::operator[]((char *)local_180);
    local_164 = cv::FileNode::operator_cast_to_float(local_180);
    cv::FileStorage::operator[]((char *)local_1a0);
    local_184 = cv::FileNode::operator_cast_to_float(local_1a0);
    cv::FileStorage::operator[]((char *)local_1c0);
    local_1a4 = cv::FileNode::operator_cast_to_float(local_1c0);
    cv::FileStorage::operator[]((char *)local_1e0);
    local_1c4 = cv::FileNode::operator_cast_to_float(local_1e0);
    cv::FileStorage::operator[]((char *)local_200);
    local_1e4 = cv::FileNode::operator_cast_to_float(local_200);
    cv::Mat_<float>::Mat_(&local_348,3,4);
    cv::operator<<(&local_2e8,&local_348,local_164);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(&local_2e8,0.0);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,local_1a4);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,0.0);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,0.0);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,local_184);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,local_1c4);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,0.0);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,0);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,0.0);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,1.0);
    pMVar5 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<float>::operator_(pMVar4,0.0);
    cv::MatCommaInitializer_::operator_cast_to_Mat_(&local_2c0,pMVar5);
    cv::Mat::Mat(local_260,&local_2c0.super_Mat);
    cv::Mat_<float>::~Mat_(&local_2c0);
    cv::Mat_<float>::~Mat_(&local_348);
    cv::Mat_<float>::Mat_(&local_490,3,4);
    cv::operator<<(&local_430,&local_490,local_164);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(&local_430,0.0);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,local_1a4);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,local_1e4);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,0.0);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,local_184);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,local_1c4);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,0.0);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,0);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,0.0);
    pMVar4 = cv::MatCommaInitializer_<float>::operator_(pMVar4,1.0);
    pMVar5 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<float>::operator_(pMVar4,0.0);
    cv::MatCommaInitializer_::operator_cast_to_Mat_(&local_408,pMVar5);
    cv::Mat::Mat(local_3a8,&local_408.super_Mat);
    cv::Mat_<float>::~Mat_(&local_408);
    cv::Mat_<float>::~Mat_(&local_490);
    poVar3 = std::operator<<((ostream *)&std::cout,"P_left: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = cv::operator<<(poVar3,local_260);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"P_right: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = cv::operator<<(poVar3,local_3a8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    cv::Mat::eye((int)local_650,3,3);
    cv::MatExpr::operator_cast_to_Mat(local_4f0);
    cv::MatExpr::~MatExpr(local_650);
    cv::Mat::zeros((int)local_810,3,1);
    cv::MatExpr::operator_cast_to_Mat(local_6b0);
    cv::MatExpr::~MatExpr(local_810);
    cv::Mat::zeros((int)local_9d0,3,1);
    cv::MatExpr::operator_cast_to_Mat(local_870);
    cv::MatExpr::~MatExpr(local_9d0);
    cv::Mat::eye((int)local_b90,3,3);
    cv::MatExpr::operator_cast_to_Mat(local_a30);
    cv::MatExpr::~MatExpr(local_b90);
    cv::Mat::eye((int)local_d50,4,4);
    cv::MatExpr::operator_cast_to_Mat(local_bf0);
    cv::MatExpr::~MatExpr(local_d50);
    cv::Mat::eye((int)local_f10,4,4);
    cv::MatExpr::operator_cast_to_Mat(local_db0);
    cv::MatExpr::~MatExpr(local_f10);
    poVar3 = std::operator<<((ostream *)&std::cout,"frame_pose ");
    poVar3 = cv::operator<<(poVar3,(Mat *)local_bf0);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    cv::Mat::zeros((int)&currentVOFeatures + 0x28,600,0x4b0);
    cv::MatExpr::operator_cast_to_Mat(local_f70);
    cv::MatExpr::~MatExpr
              ((MatExpr *)
               &currentVOFeatures.ages.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    FeatureSet::FeatureSet((FeatureSet *)local_1100);
    cv::Mat::Mat(local_1160);
    cv::Mat::Mat(local_11c0);
    cv::Mat::Mat(local_1228);
    cv::Mat::Mat((Mat *)&pCamera);
    pIStack_1290 = (Intel_V4L2 *)0x0;
    if ((pose_matrix_gt.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
      cv::Mat::Mat(local_12f8);
      std::__cxx11::string::string(local_1318,local_d0);
      loadImageLeft(local_12f8,&pCamera,0,local_1318);
      std::__cxx11::string::~string(local_1318);
      cv::Mat::Mat(local_1378);
      std::__cxx11::string::string((string *)&t_a,local_d0);
      loadImageRight(local_1378,local_1228,0,&t_a);
      std::__cxx11::string::~string((string *)&t_a);
      cv::Mat::~Mat(local_1378);
      cv::Mat::~Mat(local_12f8);
    }
    else {
      pIStack_1290 = (Intel_V4L2 *)operator_new(0x38);
      Intel_V4L2::Intel_V4L2(pIStack_1290);
      for (local_1294 = 10; -1 < local_1294; local_1294 = local_1294 + -1) {
        (**(code **)(*(long *)pIStack_1290 + 0x18))(pIStack_1290,&pCamera,local_1228);
      }
    }
    std::vector<FeaturePoint,_std::allocator<FeaturePoint>_>::vector
              ((vector<FeaturePoint,_std::allocator<FeaturePoint>_> *)
               &currentFeaturePointsLeft.
                super__Vector_base<FeaturePoint,_std::allocator<FeaturePoint>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<FeaturePoint,_std::allocator<FeaturePoint>_>::vector
              ((vector<FeaturePoint,_std::allocator<FeaturePoint>_> *)local_13d8);
    for (local_13dc = 1; local_13dc < 9000; local_13dc = local_13dc + 1) {
      poVar3 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"frame id ");
      pvVar6 = (void *)std::ostream::operator<<(poVar3,local_13dc);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      cv::Mat::Mat(local_1440);
      cv::Mat::Mat(local_14a0);
      if ((pose_matrix_gt.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
        cv::Mat::Mat(local_1500);
        std::__cxx11::string::string(local_1520,local_d0);
        loadImageLeft(local_1500,local_14a0,local_13dc,local_1520);
        std::__cxx11::string::~string(local_1520);
        cv::Mat::Mat(local_1580);
        std::__cxx11::string::string
                  ((string *)
                   &oldPointsLeft_t0.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,local_d0);
        loadImageRight(local_1580,local_1440,local_13dc,
                       &oldPointsLeft_t0.
                        super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &oldPointsLeft_t0.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        cv::Mat::~Mat(local_1580);
        cv::Mat::~Mat(local_1500);
      }
      else {
        (**(code **)(*(long *)pIStack_1290 + 0x18))(pIStack_1290,local_14a0,local_1440);
      }
      cVar7 = clock();
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &pointsLeft_t0.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,
                 (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_1100);
      this = &pointsRight_t0.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)this);
      this_00 = &pointsLeft_t1.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)this_00);
      this_01 = &pointsRight_t1.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)this_01);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &currentPointsLeft_t0);
      matchingFeatures((Mat *)&pCamera,local_1228,local_14a0,local_1440,(FeatureSet *)local_1100,
                       (vector *)this,(vector *)this_00,(vector *)this_01,
                       (vector *)&currentPointsLeft_t0);
      cv::Mat::operator=((Mat *)&pCamera,local_14a0);
      cv::Mat::operator=(local_1228,local_1440);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &valid.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_1668);
      cv::Mat::Mat(local_16c8);
      cv::Mat::Mat(local_1728);
      cv::_InputArray::_InputArray(&local_1740,local_260);
      cv::_InputArray::_InputArray(&local_1758,local_3a8);
      cv::_InputArray::_InputArray<cv::Point_<float>>
                (&local_1770,
                 (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &pointsRight_t0.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      cv::_InputArray::_InputArray<cv::Point_<float>>
                (&local_1788,
                 (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &pointsLeft_t1.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      cv::_OutputArray::_OutputArray(&local_17a0,local_1728);
      cv::triangulatePoints(&local_1740,&local_1758,&local_1770,&local_1788,&local_17a0);
      cv::_OutputArray::~_OutputArray(&local_17a0);
      cv::_InputArray::~_InputArray(&local_1788);
      cv::_InputArray::~_InputArray(&local_1770);
      cv::_InputArray::~_InputArray(&local_1758);
      cv::_InputArray::~_InputArray(&local_1740);
      cv::Mat::t();
      cv::_InputArray::_InputArray(&local_17b8,local_1918);
      cv::_OutputArray::_OutputArray((_OutputArray *)&tic_gpu,local_16c8);
      cv::convertPointsFromHomogeneous(&local_17b8,(_OutputArray *)&tic_gpu);
      cv::_OutputArray::~_OutputArray((_OutputArray *)&tic_gpu);
      cv::_InputArray::~_InputArray(&local_17b8);
      cv::MatExpr::~MatExpr(local_1918);
      cVar8 = clock();
      trackingFrame2Frame(local_260,local_3a8,
                          (vector *)
                          &pointsRight_t0.
                           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector *)
                          &pointsRight_t1.
                           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,local_16c8,
                          (Mat *)local_4f0,(Mat *)local_6b0,false);
      cVar9 = clock();
      poVar3 = std::operator<<((ostream *)&std::cerr,"tracking frame 2 frame: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,((float)(cVar9 - cVar8) / 1e+06) * 1000.0)
      ;
      poVar3 = std::operator<<(poVar3,"ms");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      displayTracking(local_14a0,
                      (vector *)
                      &pointsRight_t0.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector *)
                      &pointsRight_t1.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
      rotationMatrixToEulerAngles(local_194c);
      cv::Mat::Mat((Mat *)&fps);
      pVVar10 = (Vec<float,_3> *)local_194c;
      cv::Vec<float,_3>::operator[](pVVar10,1);
      std::abs((int)pVVar10);
      if (0.1 <= extraout_XMM0_Da) {
LAB_00107c95:
        poVar3 = std::operator<<((ostream *)&std::cout,"Too large rotation");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        pVVar10 = (Vec<float,_3> *)local_194c;
        cv::Vec<float,_3>::operator[](pVVar10,0);
        std::abs((int)pVVar10);
        if (0.1 <= extraout_XMM0_Da_00) goto LAB_00107c95;
        pVVar10 = (Vec<float,_3> *)local_194c;
        cv::Vec<float,_3>::operator[](pVVar10,2);
        std::abs((int)pVVar10);
        if (0.1 <= extraout_XMM0_Da_01) goto LAB_00107c95;
        integrateOdometryStereo
                  (local_13dc,(Mat *)&fps,(Mat *)local_bf0,(Mat *)local_4f0,(Mat *)local_6b0);
      }
      cVar8 = clock();
      fVar11 = (float)(((double)(cVar8 - cVar7) * 1000.0) / 1000000.0);
      fVar12 = 1000.0 / fVar11;
      poVar3 = std::operator<<((ostream *)&std::cout,"[Info] frame times (ms): ");
      pvVar6 = (void *)std::ostream::operator<<(poVar3,fVar11);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"[Info] FPS: ");
      pvVar6 = (void *)std::ostream::operator<<(poVar3,fVar12);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      cv::Mat::col(local_1a78,(int)local_bf0);
      cv::Mat::clone();
      cv::Mat::~Mat(local_1a78);
      display(local_13dc,(Mat *)local_f70,local_1a18,(vector *)local_38,fVar12,
              (bool)(pose_matrix_gt.super__Vector_base<Matrix,_std::allocator<Matrix>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      cv::Mat::~Mat(local_1a18);
      cv::Mat::~Mat((Mat *)&fps);
      cv::Mat::~Mat(local_1728);
      cv::Mat::~Mat(local_16c8);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_1668);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &valid.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &currentPointsLeft_t0);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &pointsRight_t1.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &pointsLeft_t1.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &pointsRight_t0.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &pointsLeft_t0.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      cv::Mat::~Mat(local_14a0);
      cv::Mat::~Mat(local_1440);
    }
    argv_local._4_4_ = 0;
    std::vector<FeaturePoint,_std::allocator<FeaturePoint>_>::~vector
              ((vector<FeaturePoint,_std::allocator<FeaturePoint>_> *)local_13d8);
    std::vector<FeaturePoint,_std::allocator<FeaturePoint>_>::~vector
              ((vector<FeaturePoint,_std::allocator<FeaturePoint>_> *)
               &currentFeaturePointsLeft.
                super__Vector_base<FeaturePoint,_std::allocator<FeaturePoint>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    cv::Mat::~Mat((Mat *)&pCamera);
    cv::Mat::~Mat(local_1228);
    cv::Mat::~Mat(local_11c0);
    cv::Mat::~Mat(local_1160);
    FeatureSet::~FeatureSet((FeatureSet *)local_1100);
    cv::Mat::~Mat((Mat *)local_f70);
    cv::Mat::~Mat((Mat *)local_db0);
    cv::Mat::~Mat((Mat *)local_bf0);
    cv::Mat::~Mat((Mat *)local_a30);
    cv::Mat::~Mat((Mat *)local_870);
    cv::Mat::~Mat((Mat *)local_6b0);
    cv::Mat::~Mat((Mat *)local_4f0);
    cv::Mat::~Mat(local_3a8);
    cv::Mat::~Mat(local_260);
    cv::FileStorage::~FileStorage(local_140);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_d0);
  }
  std::vector<Matrix,_std::allocator<Matrix>_>::~vector
            ((vector<Matrix,_std::allocator<Matrix>_> *)local_38);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{

    // -----------------------------------------
    // Load images and calibration parameters
    // -----------------------------------------
    bool display_ground_truth = false;
    bool use_intel_rgbd = false;
    std::vector<Matrix> pose_matrix_gt;
    if(argc == 4)
    {   display_ground_truth = true;
        cerr << "Display ground truth trajectory" << endl;
        // load ground truth pose
        string filename_pose = string(argv[3]);
        pose_matrix_gt = loadPoses(filename_pose);

    }
    if(argc < 3)
    {
        cerr << "Usage: ./run path_to_sequence(rgbd for using intel rgbd) path_to_calibration [optional]path_to_ground_truth_pose" << endl;
        return 1;
    }

    // Sequence
    string filepath = string(argv[1]);
    cout << "Filepath: " << filepath << endl;

    if(filepath == "rgbd") use_intel_rgbd = true;

    // Camera calibration
    string strSettingPath = string(argv[2]);
    cout << "Calibration Filepath: " << strSettingPath << endl;

    cv::FileStorage fSettings(strSettingPath, cv::FileStorage::READ);

    
    float fx = fSettings["Camera.fx"];
    float fy = fSettings["Camera.fy"];
    float cx = fSettings["Camera.cx"];
    float cy = fSettings["Camera.cy"];
    float bf = fSettings["Camera.bf"];

    cv::Mat projMatrl = (cv::Mat_<float>(3, 4) << fx, 0., cx, 0., 0., fy, cy, 0., 0,  0., 1., 0.);
    cv::Mat projMatrr = (cv::Mat_<float>(3, 4) << fx, 0., cx, bf, 0., fy, cy, 0., 0,  0., 1., 0.);
    cout << "P_left: " << endl << projMatrl << endl;
    cout << "P_right: " << endl << projMatrr << endl;

    // -----------------------------------------
    // Initialize variables
    // -----------------------------------------
    cv::Mat rotation = cv::Mat::eye(3, 3, CV_64F);
    cv::Mat translation = cv::Mat::zeros(3, 1, CV_64F);

    cv::Mat pose = cv::Mat::zeros(3, 1, CV_64F);
    cv::Mat Rpose = cv::Mat::eye(3, 3, CV_64F);
    
    cv::Mat frame_pose = cv::Mat::eye(4, 4, CV_64F);
    cv::Mat frame_pose32 = cv::Mat::eye(4, 4, CV_32F);

    std::cout << "frame_pose " << frame_pose << std::endl;
    cv::Mat trajectory = cv::Mat::zeros(600, 1200, CV_8UC3);
    FeatureSet currentVOFeatures;
    cv::Mat points4D, points3D;
    int init_frame_id = 0;

    // ------------------------
    // Load first images
    // ------------------------
    cv::Mat imageRight_t0,  imageLeft_t0;
    CameraBase *pCamera = NULL;
    if(use_intel_rgbd)
    {   
        pCamera = new Intel_V4L2;
        for (int throw_frames = 10 ; throw_frames >=0 ; throw_frames--)
            pCamera->getLRFrames(imageLeft_t0,imageRight_t0);
    }
    else
    {
        cv::Mat imageLeft_t0_color;
        loadImageLeft(imageLeft_t0_color,  imageLeft_t0, init_frame_id, filepath);
        
        cv::Mat imageRight_t0_color;  
        loadImageRight(imageRight_t0_color, imageRight_t0, init_frame_id, filepath);
    }
    clock_t t_a, t_b;

    // -----------------------------------------
    // Run visual odometry
    // -----------------------------------------
    std::vector<FeaturePoint> oldFeaturePointsLeft;
    std::vector<FeaturePoint> currentFeaturePointsLeft;

    for (int frame_id = init_frame_id+1; frame_id < 9000; frame_id++)
    {

        std::cout << std::endl << "frame id " << frame_id << std::endl;
        // ------------
        // Load images
        // ------------
        cv::Mat imageRight_t1,  imageLeft_t1;
        if(use_intel_rgbd)
        {
            pCamera->getLRFrames(imageLeft_t1,imageRight_t1);
        }
        else
        {
            cv::Mat imageLeft_t1_color;
            loadImageLeft(imageLeft_t1_color,  imageLeft_t1, frame_id, filepath);        
            cv::Mat imageRight_t1_color;  
            loadImageRight(imageRight_t1_color, imageRight_t1, frame_id, filepath);            
        }


        t_a = clock();
        std::vector<cv::Point2f> oldPointsLeft_t0 = currentVOFeatures.points;


        std::vector<cv::Point2f> pointsLeft_t0, pointsRight_t0, pointsLeft_t1, pointsRight_t1;  
        matchingFeatures( imageLeft_t0, imageRight_t0,
                          imageLeft_t1, imageRight_t1, 
                          currentVOFeatures,
                          pointsLeft_t0, 
                          pointsRight_t0, 
                          pointsLeft_t1, 
                          pointsRight_t1);  

        imageLeft_t0 = imageLeft_t1;
        imageRight_t0 = imageRight_t1;

        std::vector<cv::Point2f>& currentPointsLeft_t0 = pointsLeft_t0;
        std::vector<cv::Point2f>& currentPointsLeft_t1 = pointsLeft_t1;
        
        std::vector<cv::Point2f> newPoints;
        std::vector<bool> valid; // valid new points are ture

        // ---------------------
        // Triangulate 3D Points
        // ---------------------
        cv::Mat points3D_t0, points4D_t0;
        cv::triangulatePoints( projMatrl,  projMatrr,  pointsLeft_t0,  pointsRight_t0,  points4D_t0);
        cv::convertPointsFromHomogeneous(points4D_t0.t(), points3D_t0);

/*        cv::Mat points3D_t1, points4D_t1;
        cv::triangulatePoints( projMatrl,  projMatrr,  pointsLeft_t1,  pointsRight_t1,  points4D_t1);
        cv::convertPointsFromHomogeneous(points4D_t1.t(), points3D_t1);*/

        // ---------------------
        // Tracking transfomation
        // ---------------------
	clock_t tic_gpu = clock();
        trackingFrame2Frame(projMatrl, projMatrr, pointsLeft_t0, pointsLeft_t1, points3D_t0, rotation, translation, false);
	clock_t toc_gpu = clock();
	std::cerr << "tracking frame 2 frame: " << float(toc_gpu - tic_gpu)/CLOCKS_PER_SEC*1000 << "ms" << std::endl;
        displayTracking(imageLeft_t1, pointsLeft_t0, pointsLeft_t1);


/*        points4D = points4D_t0;
        frame_pose.convertTo(frame_pose32, CV_32F);
        points4D = frame_pose32 * points4D;
        cv::convertPointsFromHomogeneous(points4D.t(), points3D);*/

        // ------------------------------------------------
        // Intergrating and display
        // ------------------------------------------------

        cv::Vec3f rotation_euler = rotationMatrixToEulerAngles(rotation);


        cv::Mat rigid_body_transformation;

        if(abs(rotation_euler[1])<0.1 && abs(rotation_euler[0])<0.1 && abs(rotation_euler[2])<0.1)
        {
            integrateOdometryStereo(frame_id, rigid_body_transformation, frame_pose, rotation, translation);

        } else {

            std::cout << "Too large rotation"  << std::endl;
        }
        t_b = clock();
        float frame_time = 1000*(double)(t_b-t_a)/CLOCKS_PER_SEC;
        float fps = 1000/frame_time;
        cout << "[Info] frame times (ms): " << frame_time << endl;
        cout << "[Info] FPS: " << fps << endl;

        // std::cout << "rigid_body_transformation" << rigid_body_transformation << std::endl;
        // std::cout << "rotation: " << rotation_euler << std::endl;
        // std::cout << "translation: " << translation.t() << std::endl;
        // std::cout << "frame_pose" << frame_pose << std::endl;


        cv::Mat xyz = frame_pose.col(3).clone();
        display(frame_id, trajectory, xyz, pose_matrix_gt, fps, display_ground_truth);

    }

    return 0;
}